

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O1

void savegame(memfile *mf)

{
  xchar xVar1;
  s_level **ppsVar2;
  int value;
  uint value_00;
  int i;
  int32_t value_01;
  s_level *psVar3;
  long lVar4;
  char cVar5;
  
  store_version(mf);
  mwrite32(mf,flags.ident);
  mwrite32(mf,flags.moonphase);
  mwrite32(mf,flags.no_of_wizards);
  mwrite32(mf,flags.init_role);
  mwrite32(mf,flags.init_race);
  mwrite32(mf,flags.init_gend);
  mwrite32(mf,flags.init_align);
  mwrite32(mf,flags.randomall);
  mwrite32(mf,flags.pantheon);
  mwrite32(mf,flags.run);
  mwrite32(mf,flags.warntype);
  mwrite32(mf,flags.djinni_count);
  mwrite32(mf,flags.ghost_count);
  mwrite32(mf,flags.pickup_burden);
  mwrite8(mf,flags.autodig);
  mwrite8(mf,flags.autoquiver);
  mwrite8(mf,flags.autounlock);
  mwrite8(mf,flags.beginner);
  mwrite8(mf,flags.debug);
  mwrite8(mf,flags.explore);
  mwrite8(mf,flags.tutorial);
  mwrite8(mf,flags.female);
  mwrite8(mf,flags.forcefight);
  mwrite8(mf,flags.friday13);
  mwrite8(mf,flags.legacy);
  mwrite8(mf,flags.lit_corridor);
  mwrite8(mf,flags.made_amulet);
  mwrite8(mf,flags.mon_moving);
  mwrite8(mf,flags.move);
  mwrite8(mf,flags.mv);
  mwrite8(mf,flags.nopick);
  mwrite8(mf,flags.pickup);
  mwrite8(mf,flags.pushweapon);
  mwrite8(mf,flags.rest_on_space);
  mwrite8(mf,flags.safe_dog);
  mwrite8(mf,flags.safe_peaceful);
  mwrite8(mf,flags.silent);
  mwrite8(mf,flags.sortpack);
  mwrite8(mf,flags.soundok);
  mwrite8(mf,flags.sparkle);
  mwrite8(mf,flags.tombstone);
  mwrite8(mf,flags.verbose);
  mwrite8(mf,flags.prayconfirm);
  mwrite8(mf,flags.travel);
  mwrite8(mf,flags.end_disclose);
  mwrite8(mf,flags.menu_style);
  mwrite8(mf,flags.elbereth_enabled);
  mwrite8(mf,flags.rogue_enabled);
  mwrite8(mf,flags.seduce_enabled);
  mwrite8(mf,flags.bones_enabled);
  mwrite8(mf,flags.ascet);
  mwrite8(mf,flags.atheist);
  mwrite8(mf,flags.blindfolded);
  mwrite8(mf,flags.illiterate);
  mwrite8(mf,flags.pacifist);
  mwrite8(mf,flags.nudist);
  mwrite8(mf,flags.vegan);
  mwrite8(mf,flags.vegetarian);
  mwrite(mf,flags.inv_order,0x12);
  mwrite(mf,flags.spell_order,0x34);
  save_you(mf,&u);
  mwrite32(mf,moves);
  save_mon(mf,&youmonst);
  save_dungeon(mf);
  ppsVar2 = &sp_levchn;
  value = -1;
  do {
    ppsVar2 = &((s_level *)ppsVar2)->next->next;
    value = value + 1;
  } while ((s_level *)ppsVar2 != (s_level *)0x0);
  mwrite32(mf,value);
  for (psVar3 = sp_levchn; psVar3 != (s_level *)0x0; psVar3 = psVar3->next) {
    save_d_flags(mf,psVar3->flags);
    mwrite(mf,&psVar3->dlevel,2);
    mwrite(mf,psVar3->proto,0xf);
    mwrite8(mf,psVar3->boneid);
    mwrite8(mf,psVar3->rndlevs);
  }
  value_01 = 0;
  mtag(mf,0,MTAG_LEVELS);
  xVar1 = maxledgerno();
  if ('\0' < xVar1) {
    value_01 = 0;
    cVar5 = '\x01';
    do {
      value_01 = (value_01 + 1) - (uint)(levels[cVar5] == (level *)0x0);
      cVar5 = cVar5 + '\x01';
      xVar1 = maxledgerno();
    } while (cVar5 <= xVar1);
  }
  mwrite32(mf,value_01);
  xVar1 = maxledgerno();
  if ('\0' < xVar1) {
    cVar5 = '\x01';
    do {
      if (levels[cVar5] != (level *)0x0) {
        mtag(mf,(long)cVar5,MTAG_LEVELS);
        mwrite8(mf,cVar5);
        savelev(mf,cVar5);
      }
      cVar5 = cVar5 + '\x01';
      xVar1 = maxledgerno();
    } while (cVar5 <= xVar1);
  }
  mtag(mf,0,MTAG_GAMESTATE);
  mfmagic_set(mf,0x54415453);
  save_timeout(mf);
  save_timers(mf,level,1);
  save_light_sources(mf,level,1);
  saveobjchn(mf,invent);
  saveobjchn(mf,magic_chest_objs);
  savemonchn(mf,migrating_mons);
  mtag(mf,0,MTAG_MVITALS);
  lVar4 = 2;
  do {
    mwrite8(mf,*(int8_t *)((long)zeroobj.oextra + lVar4 + 2));
    mwrite8(mf,*(int8_t *)((long)zeroobj.oextra + lVar4 + 3));
    mwrite8(mf,(&mvitals[0].born)[lVar4]);
    lVar4 = lVar4 + 3;
  } while (lVar4 != 0x4bb);
  mwrite32(mf,(uint)quest_status._0_4_ >> 9 & 0x800 |
              (uint)quest_status._0_4_ >> 7 & 0x1000 |
              (uint)quest_status._0_4_ >> 5 & 0x2000 |
              (uint)quest_status._0_4_ >> 3 & 0x4000 | (uint)quest_status._0_4_ >> 1 & 0x8000 |
              quest_status._0_4_ * 2 & 0x10000U |
              quest_status._0_4_ * 8 & 0x20000U |
              (quest_status._0_4_ & 0x2000) << 5 |
              (quest_status._0_4_ & 0x1c00) << 9 |
              (quest_status._0_4_ & 0x200) << 0xd |
              (quest_status._0_4_ & 0x100) << 0xf | (quest_status._0_4_ & 0x80) << 0x11 |
              (quest_status._0_4_ & 0x40) << 0x13 |
              (quest_status._0_4_ & 0x20) << 0x15 |
              (quest_status._0_4_ & 0x1c) << 0x19 |
              (quest_status._0_4_ & 2) << 0x1d | quest_status._0_4_ << 0x1f);
  mwrite32(mf,quest_status.leader_m_id);
  lVar4 = 0;
  do {
    mwrite32(mf,spl_book[lVar4].sp_know);
    mwrite16(mf,spl_book[lVar4].sp_id);
    mwrite8(mf,spl_book[lVar4].sp_lev);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x2c);
  save_artifacts(mf);
  save_oracles(mf);
  save_tutorial(mf);
  mwrite(mf,pl_character,0x20);
  mwrite(mf,pl_fruit,0x20);
  mwrite32(mf,current_fruit);
  savefruitchn(mf);
  savenames(mf);
  save_waterlevel(mf);
  mwrite32(mf,lastinvnr);
  save_mt_state(mf);
  save_track(mf);
  save_food(mf);
  save_steal(mf);
  save_dig_status(mf);
  save_occupations(mf);
  if (book == (obj *)0x0) {
    value_00 = 0;
  }
  else {
    value_00 = book->o_id;
  }
  mwrite32(mf,value_00);
  mwrite32(mf,stetho_last_used_move);
  mwrite32(mf,stetho_last_used_movement);
  mwrite32(mf,multi);
  save_rndmonst_state(mf);
  save_history(mf);
  return;
}

Assistant:

void savegame(struct memfile *mf)
{
	int count = 0;
	xchar ltmp;

	/* no tag useful here as store_version adds one */
	store_version(mf);

	/* Place flags, player info & moves at the beginning of the save.
	 * This makes it possible to read them in nh_get_savegame_status without
	 * parsing all the dungeon and level data */
	save_flags(mf);
	save_you(mf, &u);
	mwrite32(mf, moves); /* no tag useful here; you is fixed-length */
	save_mon(mf, &youmonst);

	/* store dungeon layout */
	save_dungeon(mf);
	savelevchn(mf);

	/* store levels */
	mtag(mf, 0, MTAG_LEVELS);
	for (ltmp = 1; ltmp <= maxledgerno(); ltmp++)
	    if (levels[ltmp])
		count++;
	mwrite32(mf, count);
	for (ltmp = 1; ltmp <= maxledgerno(); ltmp++) {
		if (!levels[ltmp])
		    continue;
		mtag(mf, ltmp, MTAG_LEVELS);
		mwrite8(mf, ltmp); /* level number*/
		savelev(mf, ltmp); /* actual level*/
	}
	savegamestate(mf);
}